

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O0

void kv_get_str_kv_size_test(btree_kv_ops *kv_ops)

{
  ulong uVar1;
  size_t sVar2;
  long lVar3;
  size_t sVar4;
  long in_RDI;
  char str [11];
  size_t size;
  int v;
  btree *tree;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  undefined1 local_b8 [61];
  char local_7b [11];
  ulong local_70;
  undefined4 local_64;
  undefined1 *local_60;
  __time_t local_38;
  __suseconds_t local_30;
  timeval local_18;
  long local_8;
  
  local_8 = in_RDI;
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  local_38 = local_18.tv_sec;
  local_30 = local_18.tv_usec;
  memleak_start();
  builtin_strncpy(local_7b,"teststring",0xb);
  local_60 = local_b8;
  sVar2 = strlen(local_7b);
  *local_60 = (char)sVar2;
  local_60[1] = 4;
  local_64 = 1;
  lVar3 = (**(code **)(local_8 + 0x28))(local_60,local_7b,&local_64);
  local_70 = lVar3;
  sVar2 = strlen(local_7b);
  if (lVar3 != sVar2 + 4) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x220);
    uVar1 = local_70;
    kv_get_str_kv_size_test::__test_pass = 0;
    sVar2 = strlen(local_7b);
    if (uVar1 != sVar2 + 4) {
      __assert_fail("size == (strlen(str) + sizeof(v))",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x220,"void kv_get_str_kv_size_test(btree_kv_ops *)");
    }
  }
  local_70 = (**(code **)(local_8 + 0x28))(local_60,0,&local_64);
  if (local_70 != (byte)local_60[1]) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x224);
    kv_get_str_kv_size_test::__test_pass = 0;
    if (local_70 != (byte)local_60[1]) {
      __assert_fail("size == (tree->vsize)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x224,"void kv_get_str_kv_size_test(btree_kv_ops *)");
    }
  }
  sVar2 = (**(code **)(local_8 + 0x28))(local_60,local_7b,0);
  local_70 = sVar2;
  sVar4 = strlen(local_7b);
  if (sVar2 != sVar4) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x228);
    uVar1 = local_70;
    kv_get_str_kv_size_test::__test_pass = 0;
    sVar2 = strlen(local_7b);
    if (uVar1 != sVar2) {
      __assert_fail("size == (strlen(str))",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x228,"void kv_get_str_kv_size_test(btree_kv_ops *)");
    }
  }
  local_70 = (**(code **)(local_8 + 0x28))(local_60,0);
  if (local_70 != 0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
            ,0x22c);
    kv_get_str_kv_size_test::__test_pass = 0;
    if (local_70 != 0) {
      __assert_fail("size == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_kv_test.cc"
                    ,0x22c,"void kv_get_str_kv_size_test(btree_kv_ops *)");
    }
  }
  memleak_end();
  if (kv_get_str_kv_size_test::__test_pass == 0) {
    fprintf(_stderr,"%s FAILED\n","kv_get_str_kv_size_test");
  }
  else {
    fprintf(_stderr,"%s PASSED\n","kv_get_str_kv_size_test");
  }
  return;
}

Assistant:

void kv_get_str_kv_size_test(btree_kv_ops *kv_ops)
{
    TEST_INIT();
    memleak_start();

    btree *tree;
    int v;
    size_t size;
    char str[] = "teststring";

    tree = alca(struct btree, 1);
    tree->ksize = strlen(str);
    tree->vsize = sizeof(v);
    v = 1;

    // get/verify size of kv string
    size = kv_ops->get_kv_size(tree, str, (void *)&v);
    TEST_CHK(size == (strlen(str) + sizeof(v)));

    // verify with NULL key
    size = kv_ops->get_kv_size(tree, NULL, (void *)&v);
    TEST_CHK(size == (tree->vsize));

    // verify with NULL value
    size = kv_ops->get_kv_size(tree,&str, NULL);
    TEST_CHK(size == (strlen(str)));

    // NULL key/value
    size = kv_ops->get_kv_size(tree, NULL, NULL);
    TEST_CHK(size == 0);

    memleak_end();
    TEST_RESULT("kv_get_str_kv_size_test");
}